

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true> __thiscall
duckdb::BlockingSample::Deserialize(BlockingSample *this,Deserializer *deserializer)

{
  _func_int **pp_Var1;
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  __p;
  SampleType SVar2;
  bool bVar3;
  pointer pBVar4;
  SerializationException *this_00;
  allocator local_49;
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  base_reservoir_sample;
  _Alloc_hider local_40;
  
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::BaseReservoirSampling,std::default_delete<duckdb::BaseReservoirSampling>,true>>
            ((Deserializer *)&base_reservoir_sample,(field_id_t)deserializer,(char *)0x64);
  SVar2 = Deserializer::ReadProperty<duckdb::SampleType>(deserializer,0x65,"type");
  bVar3 = Deserializer::ReadPropertyWithDefault<bool>(deserializer,0x66,"destroyed");
  this->_vptr_BlockingSample = (_func_int **)0x0;
  if (SVar2 == RESERVOIR_SAMPLE) {
    ReservoirSample::Deserialize((ReservoirSample *)&stack0xffffffffffffffc0,deserializer);
  }
  else {
    if (SVar2 != RESERVOIR_PERCENTAGE_SAMPLE) {
      this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffc0,
                 "Unsupported type for deserialization of BlockingSample!",&local_49);
      SerializationException::SerializationException(this_00,(string *)&stack0xffffffffffffffc0);
      __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ReservoirSamplePercentage::Deserialize
              ((ReservoirSamplePercentage *)&stack0xffffffffffffffc0,deserializer);
  }
  pp_Var1 = this->_vptr_BlockingSample;
  this->_vptr_BlockingSample = (_func_int **)local_40._M_p;
  if (pp_Var1 != (_func_int **)0x0) {
    (**(code **)(*pp_Var1 + 8))();
  }
  pBVar4 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
           operator->((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                       *)this);
  __p = base_reservoir_sample;
  base_reservoir_sample.
  super_unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BaseReservoirSampling_*,_std::default_delete<duckdb::BaseReservoirSampling>_>
  .super__Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
        )(__uniq_ptr_data<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true,_true>
          )0x0;
  ::std::
  __uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
  ::reset((__uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
           *)&pBVar4->base_reservoir_sample,
          (pointer)__p.
                   super_unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::BaseReservoirSampling_*,_std::default_delete<duckdb::BaseReservoirSampling>_>
                   .super__Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false>._M_head_impl);
  pBVar4 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
           operator->((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                       *)this);
  pBVar4->destroyed = bVar3;
  ::std::
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>::
  ~unique_ptr(&base_reservoir_sample.
               super_unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
             );
  return (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)
         (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)this;
}

Assistant:

unique_ptr<BlockingSample> BlockingSample::Deserialize(Deserializer &deserializer) {
	auto base_reservoir_sample = deserializer.ReadPropertyWithDefault<unique_ptr<BaseReservoirSampling>>(100, "base_reservoir_sample");
	auto type = deserializer.ReadProperty<SampleType>(101, "type");
	auto destroyed = deserializer.ReadPropertyWithDefault<bool>(102, "destroyed");
	unique_ptr<BlockingSample> result;
	switch (type) {
	case SampleType::RESERVOIR_PERCENTAGE_SAMPLE:
		result = ReservoirSamplePercentage::Deserialize(deserializer);
		break;
	case SampleType::RESERVOIR_SAMPLE:
		result = ReservoirSample::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of BlockingSample!");
	}
	result->base_reservoir_sample = std::move(base_reservoir_sample);
	result->destroyed = destroyed;
	return result;
}